

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O2

int __thiscall Snes_Spc::cpu_read(Snes_Spc *this,int addr,rel_time_t time)

{
  long lVar1;
  Timer *t;
  int iVar2;
  uint uVar3;
  
  iVar2 = addr + 0xff10;
  lVar1 = (long)addr;
  do {
    if (((int)lVar1 < 0xf0) || (uVar3 = (uint)(lVar1 + -0x10000), 0xffff00ff < uVar3)) {
      return (int)(this->m).ram.ram[lVar1];
    }
    if ((int)lVar1 - 0xfdU < 3) {
      uVar3 = iVar2 - 0x1000d;
      t = (this->m).timers + uVar3;
      if (t->next_time <= time) {
        run_timer_(this,t,time);
      }
      iVar2 = (this->m).timers[uVar3].counter;
      (this->m).timers[uVar3].counter = 0;
      return iVar2;
    }
    iVar2 = iVar2 + -0x10000;
    lVar1 = lVar1 + -0x10000;
  } while (0xfc < uVar3 + 0x10000);
  iVar2 = cpu_read_smp_reg(this,iVar2,time);
  return iVar2;
}

Assistant:

int Snes_Spc::cpu_read( int addr, rel_time_t time )
{
	MEM_ACCESS( time, addr )
	
	// RAM
	int result = RAM [addr];
	int reg = addr - 0xF0;
	if ( reg >= 0 ) // 40%
	{
		reg -= 0x10;
		if ( (unsigned) reg >= 0xFF00 ) // 21%
		{
			reg += 0x10 - r_t0out;
			
			// Timers
			if ( (unsigned) reg < timer_count ) // 90%
			{
				Timer* t = &m.timers [reg];
				if ( time >= t->next_time )
					t = run_timer_( t, time );
				result = t->counter;
				t->counter = 0;
			}
			// Other registers
			else if ( reg < 0 ) // 10%
			{
				result = cpu_read_smp_reg( reg + r_t0out, time );
			}
			else // 1%
			{
				assert( reg + (r_t0out + 0xF0 - 0x10000) < 0x100 );
				result = cpu_read( reg + (r_t0out + 0xF0 - 0x10000), time );
			}
		}
	}
	
	return result;
}